

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNConstBase::adjust_for_dyn(CTPNConstBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  CTcPrsNode *pCVar4;
  
  pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)info);
  (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_0034ae40;
  *(undefined4 *)&pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  *(byte *)&pCVar4[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       *(byte *)&pCVar4[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
  pp_Var1 = (_func_int **)(this->val_).val_.intval_;
  pp_Var2 = (_func_int **)(this->val_).val_.floatval_.len_;
  pp_Var3 = *(_func_int ***)((long)&(this->val_).val_ + 0x10);
  pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = *(_func_int ***)&this->val_;
  pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  *(undefined1 *)&pCVar4[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (this->val_).field_0x20;
  pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
  pCVar4[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var3;
  (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003506b0;
  return pCVar4;
}

Assistant:

CTcPrsNode *CTPNConstBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* convert to a debugger-constant */
    return new CTPNDebugConst(&val_);
}